

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O0

bool __thiscall
cube::net::TcpConnection::Write(TcpConnection *this,char *data,size_t len,WriteCompleteCallback *cb)

{
  EventLoop *pEVar1;
  WriteCompleteCallback *pWVar2;
  bool bVar3;
  int __fd;
  uint64_t uVar4;
  size_t sVar5;
  pointer pEVar6;
  ssize_t sVar7;
  enable_shared_from_this<cube::net::TcpConnection> local_100;
  type local_f0;
  Task local_c0;
  int local_a0;
  int nwrote;
  enable_shared_from_this<cube::net::TcpConnection> local_90;
  type local_80;
  Task local_50;
  WriteCompleteCallback *local_30;
  WriteCompleteCallback *cb_local;
  size_t len_local;
  char *data_local;
  TcpConnection *this_local;
  
  local_30 = cb;
  cb_local = (WriteCompleteCallback *)len;
  len_local = (size_t)data;
  data_local = (char *)this;
  bVar3 = Closed(this);
  if (bVar3) {
    uVar4 = Id(this);
    strings::FormatString(&this->m_err_msg,"tcp connection[%lu] is closed",uVar4);
    this_local._7_1_ = false;
  }
  else if (cb_local == (WriteCompleteCallback *)0x0) {
    bVar3 = std::function::operator_cast_to_bool((function *)local_30);
    pWVar2 = local_30;
    if (bVar3) {
      pEVar1 = this->m_event_loop;
      std::enable_shared_from_this<cube::net::TcpConnection>::shared_from_this(&local_90);
      std::
      bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>)>const&,std::shared_ptr<cube::net::TcpConnection>>
                (&local_80,pWVar2,(shared_ptr<cube::net::TcpConnection> *)&local_90);
      std::function<void()>::
      function<std::_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>)>(std::shared_ptr<cube::net::TcpConnection>)>,void>
                ((function<void()> *)&local_50,&local_80);
      EventLoop::Post(pEVar1,&local_50);
      std::function<void_()>::~function(&local_50);
      std::
      _Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>_(std::shared_ptr<cube::net::TcpConnection>)>
      ::~_Bind(&local_80);
      std::shared_ptr<cube::net::TcpConnection>::~shared_ptr
                ((shared_ptr<cube::net::TcpConnection> *)&local_90);
    }
    this_local._7_1_ = true;
  }
  else {
    if ((this->m_state == ConnState_Connected) &&
       (sVar5 = Buffer::ReadableBytes(&this->m_output_buffer), sVar5 == 0)) {
      pEVar6 = std::unique_ptr<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>::
               operator->(&this->m_eventor);
      __fd = Eventor::Fd(pEVar6);
      sVar7 = write(__fd,(void *)len_local,(size_t)cb_local);
      local_a0 = (int)sVar7;
      if (-1 < local_a0) {
        if ((int)cb_local <= local_a0) {
          bVar3 = std::function::operator_cast_to_bool((function *)local_30);
          pWVar2 = local_30;
          if (bVar3) {
            pEVar1 = this->m_event_loop;
            std::enable_shared_from_this<cube::net::TcpConnection>::shared_from_this(&local_100);
            std::
            bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>)>const&,std::shared_ptr<cube::net::TcpConnection>>
                      (&local_f0,pWVar2,(shared_ptr<cube::net::TcpConnection> *)&local_100);
            std::function<void()>::
            function<std::_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>)>(std::shared_ptr<cube::net::TcpConnection>)>,void>
                      ((function<void()> *)&local_c0,&local_f0);
            EventLoop::Post(pEVar1,&local_c0);
            std::function<void_()>::~function(&local_c0);
            std::
            _Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>_(std::shared_ptr<cube::net::TcpConnection>)>
            ::~_Bind(&local_f0);
            std::shared_ptr<cube::net::TcpConnection>::~shared_ptr
                      ((shared_ptr<cube::net::TcpConnection> *)&local_100);
          }
          return true;
        }
        len_local = len_local + (long)local_a0;
        cb_local = (WriteCompleteCallback *)((long)cb_local - (long)local_a0);
      }
    }
    std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>::operator=
              (&this->m_write_complete_callback,local_30);
    Buffer::Append(&this->m_output_buffer,(char *)len_local,(size_t)cb_local);
    pEVar6 = std::unique_ptr<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>::
             operator->(&this->m_eventor);
    bVar3 = Eventor::Writing(pEVar6);
    if (!bVar3) {
      pEVar6 = std::unique_ptr<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>::
               operator->(&this->m_eventor);
      Eventor::EnableWriting(pEVar6);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TcpConnection::Write(const char *data, size_t len, const WriteCompleteCallback &cb) {
    // Not allow to send data when closed
    if (Closed()) {
        strings::FormatString(m_err_msg, "tcp connection[%lu] is closed", Id());
        return false;
    }

    if (len == 0) {
        // It is always ok to send 0-length data
        if (cb) {
            m_event_loop->Post(std::bind(cb, shared_from_this()));
        }
        return true;
    }

    // send data directly when no pending data to send
    if (m_state == ConnState_Connected && m_output_buffer.ReadableBytes() == 0) {
        int nwrote = ::write(m_eventor->Fd(), data, len);
        if (nwrote < 0) {
            // send data directly failed
            // write data to output buffer and wait for POLLIN event
        } else if (nwrote >= static_cast<int>(len)) {
            // send all data directly
            if (cb)
                m_event_loop->Post(std::bind(cb, shared_from_this()));
            return true;
        } else {
            // send some data directly but not all,
            // write the rest to output buffer
            data += nwrote;
            len -= nwrote;
        }
    }

    m_write_complete_callback = cb;
    //SetWriteCompleteCallback(cb);
    m_output_buffer.Append(data, len);
    if (!m_eventor->Writing())
        m_eventor->EnableWriting();
    return true;
}